

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O1

void __thiscall
wasm::
AnalysisChecker<wasm::analysis::FiniteIntPowersetLattice,_wasm::analysis::LivenessTransferFunction>
::checkTransferFunction
          (AnalysisChecker<wasm::analysis::FiniteIntPowersetLattice,_wasm::analysis::LivenessTransferFunction>
           *this,CFG *cfg,Element *x,Element *y,Element *z)

{
  _Bit_pointer *inputState;
  BasicBlock *bb;
  undefined1 local_c0 [8];
  Element zResult;
  undefined1 local_90 [8];
  Element yResult;
  Element xResult;
  
  bb = *(BasicBlock **)cfg;
  zResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = *(_Bit_pointer *)&cfg->field_0x8;
  if (bb != (BasicBlock *)
            zResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage) {
    do {
      inputState = &yResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage;
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)inputState,&x->bitvector);
      analysis::
      VisitorTransferFunc<wasm::analysis::LivenessTransferFunction,_wasm::analysis::FiniteIntPowersetLattice,_(wasm::analysis::AnalysisDirection)1>
      ::transfer(&this->txfn->
                  super_VisitorTransferFunc<wasm::analysis::LivenessTransferFunction,_wasm::analysis::FiniteIntPowersetLattice,_(wasm::analysis::AnalysisDirection)1>
                 ,bb,(Element *)inputState);
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)local_90,&y->bitvector);
      analysis::
      VisitorTransferFunc<wasm::analysis::LivenessTransferFunction,_wasm::analysis::FiniteIntPowersetLattice,_(wasm::analysis::AnalysisDirection)1>
      ::transfer(&this->txfn->
                  super_VisitorTransferFunc<wasm::analysis::LivenessTransferFunction,_wasm::analysis::FiniteIntPowersetLattice,_(wasm::analysis::AnalysisDirection)1>
                 ,bb,(Element *)local_90);
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)local_c0,&z->bitvector);
      analysis::
      VisitorTransferFunc<wasm::analysis::LivenessTransferFunction,_wasm::analysis::FiniteIntPowersetLattice,_(wasm::analysis::AnalysisDirection)1>
      ::transfer(&this->txfn->
                  super_VisitorTransferFunc<wasm::analysis::LivenessTransferFunction,_wasm::analysis::FiniteIntPowersetLattice,_(wasm::analysis::AnalysisDirection)1>
                 ,bb,(Element *)local_c0);
      checkMonotonicity(this,bb,x,y,
                        (Element *)
                        &yResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage,(Element *)local_90);
      checkMonotonicity(this,bb,x,z,
                        (Element *)
                        &yResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage,(Element *)local_c0);
      checkMonotonicity(this,bb,y,z,(Element *)local_90,(Element *)local_c0);
      if (local_c0 != (undefined1  [8])0x0) {
        operator_delete((void *)local_c0,
                        zResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ -
                        (long)local_c0);
        local_c0 = (undefined1  [8])0x0;
        zResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_4_ = 0;
        zResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
        zResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ = 0;
        zResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p._0_4_ = 0;
        zResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
        zResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_ = 0;
      }
      if (local_90 != (undefined1  [8])0x0) {
        operator_delete((void *)local_90,
                        yResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ -
                        (long)local_90);
        local_90 = (undefined1  [8])0x0;
        yResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_4_ = 0;
        yResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
        yResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ = 0;
        yResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p._0_4_ = 0;
        yResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
        yResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_ = 0;
      }
      if (yResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_end_of_storage != (_Bit_pointer)0x0) {
        operator_delete(yResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage,
                        xResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ -
                        (long)yResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage);
        yResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
        xResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
        xResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_ = 0;
      }
      bb = bb + 1;
    } while (bb != (BasicBlock *)
                   zResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void checkTransferFunction(CFG& cfg,
                             typename L::Element x,
                             typename L::Element y,
                             typename L::Element z) {
    for (const auto& bb : cfg) {
      // Apply transfer function on each lattice element.
      auto xResult = x;
      txfn.transfer(bb, xResult);
      auto yResult = y;
      txfn.transfer(bb, yResult);
      auto zResult = z;
      txfn.transfer(bb, zResult);

      // Check monotonicity for every pair of transfer function outputs.
      checkMonotonicity(bb, x, y, xResult, yResult);
      checkMonotonicity(bb, x, z, xResult, zResult);
      checkMonotonicity(bb, y, z, yResult, zResult);
    }
  }